

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_preview(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  int iVar1;
  uint uVar2;
  uint32_t sizes [2];
  int32_t isz;
  int local_2c;
  int local_28;
  int local_24;
  
  local_2c = ((a->field_6).chlist)->num_channels;
  local_28 = ((a->field_6).chlist)->num_alloced;
  uVar2 = local_2c * local_28 * 4;
  if (uVar2 < 0x7ffffff8) {
    local_24 = uVar2 + 8;
    iVar1 = (*ctxt->do_write)(ctxt,&local_24,4,&ctxt->output_file_offset);
  }
  else {
    iVar1 = (*ctxt->standard_error)(ctxt,3);
  }
  if (iVar1 == 0) {
    iVar1 = (*ctxt->do_write)(ctxt,&local_2c,8,&ctxt->output_file_offset);
    if (iVar1 == 0) {
      iVar1 = (*ctxt->do_write)(ctxt,(void *)((a->field_6).m33d)->m[2],(uint64_t)uVar2,
                                &ctxt->output_file_offset);
    }
  }
  return iVar1;
}

Assistant:

static exr_result_t
save_preview (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    uint32_t     sizes[2];
    size_t       prevsize = 0;

    sizes[0] = a->preview->width;
    sizes[1] = a->preview->height;
    prevsize = 4 * sizes[0] * sizes[1];

    rv = save_attr_sz (ctxt, sizeof (uint32_t) * 2 + prevsize);

    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, sizes, 2);
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt, a->preview->rgba, prevsize, &(ctxt->output_file_offset));
    return rv;
}